

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

uint16_t container_maximum(container_t *c,uint8_t type)

{
  uint16_t uVar1;
  uint8_t in_SIL;
  container_t *in_RDI;
  uint8_t local_11;
  array_container_t *local_10;
  undefined6 in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffe;
  
  local_11 = in_SIL;
  local_10 = (array_container_t *)container_unwrap_shared(in_RDI,&local_11);
  if (local_11 == '\x01') {
    uVar1 = bitset_container_maximum
                      ((bitset_container_t *)
                       CONCAT26(in_stack_fffffffffffffffe,in_stack_fffffffffffffff8));
  }
  else if (local_11 == '\x02') {
    uVar1 = array_container_maximum(local_10);
  }
  else {
    uVar1 = run_container_maximum((run_container_t *)local_10);
  }
  return uVar1;
}

Assistant:

static inline uint16_t container_maximum(const container_t *c, uint8_t type) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_maximum(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_maximum(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_maximum(const_CAST_run(c));
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return false;
}